

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

RecGroup __thiscall wasm::anon_unknown_0::RecGroupStore::insert(RecGroupStore *this,RecGroup group)

{
  ulong *puVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  HeapType HVar5;
  HeapType HVar6;
  Field *pFVar7;
  long *plVar8;
  _Hash_node_base *p_Var9;
  undefined8 *puVar10;
  bool bVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  size_t sVar15;
  long *plVar16;
  undefined8 *puVar17;
  _Hash_node_base **__s;
  _Hash_node_base *p_Var18;
  ulong uVar19;
  size_type __n;
  const_iterator __begin2;
  ulong uVar20;
  Field *pFVar21;
  ulong uVar22;
  long lVar23;
  _Hash_node_base *p_Var24;
  ulong uVar25;
  long *plVar26;
  pointer __ptr_1;
  ulong uVar27;
  Field *b;
  const_iterator __end2;
  undefined1 auVar28 [16];
  ulong local_68;
  undefined1 local_60 [8];
  __buckets_alloc_type __alloc;
  long local_48;
  
  uVar22 = 1;
  local_60 = (undefined1  [8])this;
  if (((ulong)this & 1) == 0) {
    lVar23 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
             (this->mutex).super___mutex_base._M_mutex.__align;
    if (lVar23 == 0) {
      uVar20 = 0;
      goto LAB_00cb2bdb;
    }
    uVar22 = lVar23 >> 3;
  }
  uVar25 = 0;
  local_68 = 0x9e3779b97f4a8c16;
  uVar20 = uVar22;
  do {
    lVar23 = -0x61c8864680b583ea;
    uVar19 = (ulong)this & 0xfffffffffffffffe;
    if (((ulong)this & 1) == 0) {
      uVar19 = *(ulong *)((this->mutex).super___mutex_base._M_mutex.__align + uVar25 * 8);
    }
    if (uVar19 < 0x7d) {
      uVar12 = uVar19 + 0x9e3779b97f4a8c15;
    }
    else {
      HVar5.id = *(uintptr_t *)(uVar19 + 8);
      uVar12 = 0x9e3779b97f4a7c15;
      if (HVar5.id != 0) {
        uVar12 = local_68;
      }
      uVar12 = uVar12 ^ HVar5.id != 0;
      if (HVar5.id != 0) {
        sVar13 = RecGroupHasher::hash((RecGroupHasher *)this,HVar5);
        uVar12 = uVar12 ^ sVar13 + 0xa81af155173f24d6 + uVar12 * 0x1000;
      }
      HVar5.id = *(uintptr_t *)(uVar19 + 0x10);
      lVar14 = lVar23;
      if (HVar5.id == 0) {
        lVar14 = -0x61c8864680b583eb;
      }
      uVar12 = (uVar12 >> 4) + uVar12 * 0x1000 + lVar14 ^ uVar12;
      if (HVar5.id != 0) {
        sVar13 = RecGroupHasher::hash((RecGroupHasher *)this,HVar5);
        uVar12 = uVar12 ^ (uVar12 >> 4) + sVar13 + uVar12 * 0x1000 + -0x61c8864680b583eb;
      }
      HVar5.id = *(uintptr_t *)(uVar19 + 0x18);
      if (HVar5.id == 0) {
        lVar23 = -0x61c8864680b583eb;
      }
      uVar12 = (uVar12 >> 4) + uVar12 * 0x1000 + lVar23 ^ uVar12;
      if (HVar5.id != 0) {
        sVar13 = RecGroupHasher::hash((RecGroupHasher *)this,HVar5);
        uVar12 = uVar12 ^ (uVar12 >> 4) + sVar13 + uVar12 * 0x1000 + -0x61c8864680b583eb;
      }
      iVar3 = *(int *)(uVar19 + 0x30);
      if (3 < iVar3 - 1U) {
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x7fc);
      }
      bVar2 = *(byte *)(uVar19 + 1);
      uVar4 = *(uint *)(uVar19 + 4);
      switch(iVar3) {
      case 1:
        sVar13 = RecGroupHasher::hash
                           ((RecGroupHasher *)local_60,(Type)*(uintptr_t *)(uVar19 + 0x38));
        sVar15 = RecGroupHasher::hash
                           ((RecGroupHasher *)local_60,(Type)*(uintptr_t *)(uVar19 + 0x40));
        uVar27 = (sVar13 >> 4) + sVar15 + sVar13 * 0x1000 + -0x61c8864680b583eb ^ sVar13;
        break;
      case 2:
        pFVar21 = *(Field **)(uVar19 + 0x38);
        pFVar7 = *(Field **)(uVar19 + 0x40);
        uVar27 = (long)pFVar7 - (long)pFVar21 >> 4;
        for (; pFVar7 != pFVar21; pFVar21 = pFVar21 + 1) {
          sVar13 = RecGroupHasher::hash((RecGroupHasher *)local_60,pFVar21);
          uVar27 = uVar27 ^ uVar27 * 0x1000 + -0x61c8864680b583eb + (uVar27 >> 4) + sVar13;
        }
        break;
      case 3:
        uVar27 = RecGroupHasher::hash((RecGroupHasher *)local_60,(Field *)(uVar19 + 0x38));
        break;
      case 4:
        sVar13 = RecGroupHasher::hash
                           ((RecGroupHasher *)this,(HeapType)*(uintptr_t *)(uVar19 + 0x38));
        uVar27 = (sVar13 >> 4) + sVar13 * 0x1000 + 0x9e3779b97f567d2c ^ sVar13;
      }
      uVar12 = (uVar12 >> 4) + uVar12 * 0x1000 + -0x61c8864680b583eb + (ulong)bVar2 ^ uVar12;
      uVar12 = (uVar12 >> 4) + uVar12 * 0x1000 + (ulong)uVar4 + 0x9e3779b97f4a7c15 ^ uVar12;
      uVar12 = (uVar12 >> 4) + uVar12 * 0x1000 + (long)iVar3 + -0x61c8864680b583eb ^ uVar12;
      uVar12 = (uVar12 * 0x1000 + -0x61c8864680b583eb + (uVar12 >> 4) + uVar27 ^ uVar12) +
               0x9e3779b97f4a7c15;
    }
    uVar20 = uVar20 ^ uVar20 * 0x1000 + -0x61c8864680b583eb + (uVar20 >> 4) +
                      (uVar19 < 0x7d ^ uVar12);
    uVar25 = uVar25 + 1;
  } while (uVar25 != uVar22);
LAB_00cb2bdb:
  uVar22 = uVar20 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_;
  plVar16 = *(long **)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar22 * 8);
  if (plVar16 != (long *)0x0) {
    uVar25 = ((long *)*plVar16)[2];
    plVar26 = (long *)*plVar16;
    while (uVar25 != uVar20) {
LAB_00cb2eab:
      plVar8 = (long *)*plVar26;
      if ((plVar8 == (long *)0x0) ||
         (uVar25 = plVar8[2], plVar16 = plVar26, plVar26 = plVar8,
         uVar25 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ != uVar22))
      goto LAB_00cb2ef4;
    }
    HVar5.id = plVar26[1];
    local_60 = (undefined1  [8])this;
    ___alloc = HVar5.id;
    if ((RecGroupStore *)HVar5.id != this) {
      lVar23 = 1;
      local_48 = 1;
      if (((ulong)this & 1) == 0) {
        local_48 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
                   (this->mutex).super___mutex_base._M_mutex.__align >> 3;
      }
      if ((HVar5.id & 1) == 0) {
        lVar23 = *(long *)(HVar5.id + 8) - *(long *)HVar5.id >> 3;
      }
      if (local_48 != lVar23) goto LAB_00cb2eab;
      if (local_48 != 0) {
        lVar23 = 0;
        do {
          uVar25 = (ulong)this & 0xfffffffffffffffe;
          if (((ulong)this & 1) == 0) {
            uVar25 = *(ulong *)((this->mutex).super___mutex_base._M_mutex.__align + lVar23 * 8);
          }
          uVar19 = HVar5.id & 0xfffffffffffffffe;
          if ((HVar5.id & 1) == 0) {
            uVar19 = *(ulong *)(*(long *)HVar5.id + lVar23 * 8);
          }
          if (uVar25 != uVar19) {
            if ((((((uVar25 < 0x7d) || (uVar19 < 0x7d)) ||
                  (HVar6.id = *(uintptr_t *)(uVar25 + 8),
                  (HVar6.id != 0) == (*(long *)(uVar19 + 8) == 0))) ||
                 ((HVar6.id != 0 &&
                  (bVar11 = RecGroupEquator::eq((RecGroupEquator *)this,HVar5,HVar6), !bVar11)))) ||
                ((HVar6.id = *(uintptr_t *)(uVar25 + 0x10),
                 (HVar6.id != 0) == (*(long *)(uVar19 + 0x10) == 0) ||
                 ((HVar6.id != 0 &&
                  (bVar11 = RecGroupEquator::eq((RecGroupEquator *)this,HVar5,HVar6), !bVar11))))))
               || ((HVar6.id = *(uintptr_t *)(uVar25 + 0x18),
                   (HVar6.id != 0) == (*(long *)(uVar19 + 0x18) == 0) ||
                   ((((HVar6.id != 0 &&
                      (bVar11 = RecGroupEquator::eq((RecGroupEquator *)this,HVar5,HVar6), !bVar11))
                     || (*(char *)(uVar25 + 1) != *(char *)(uVar19 + 1))) ||
                    ((*(int *)(uVar25 + 4) != *(int *)(uVar19 + 4) ||
                     (*(int *)(uVar25 + 0x30) != *(int *)(uVar19 + 0x30))))))))) goto LAB_00cb2eab;
            switch(*(int *)(uVar25 + 0x30)) {
            case 1:
              bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_60,
                                           (Type)*(uintptr_t *)(uVar25 + 0x38),
                                           (Type)*(uintptr_t *)(uVar19 + 0x38));
              if (!bVar11) goto LAB_00cb2eab;
              bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_60,
                                           (Type)*(uintptr_t *)(uVar25 + 0x40),
                                           (Type)*(uintptr_t *)(uVar19 + 0x40));
              break;
            case 2:
              pFVar21 = *(Field **)(uVar25 + 0x38);
              pFVar7 = *(Field **)(uVar25 + 0x40);
              b = *(Field **)(uVar19 + 0x38);
              if ((long)pFVar7 - (long)pFVar21 == *(long *)(uVar19 + 0x40) - (long)b) {
                for (; pFVar21 != pFVar7; pFVar21 = pFVar21 + 1) {
                  bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_60,pFVar21,b);
                  if (!bVar11) goto LAB_00cb2eab;
                  b = b + 1;
                }
                goto LAB_00cb2e43;
              }
              goto LAB_00cb2eab;
            case 3:
              bVar11 = RecGroupEquator::eq((RecGroupEquator *)local_60,(Field *)(uVar25 + 0x38),
                                           (Field *)(uVar19 + 0x38));
              break;
            case 4:
              bVar11 = RecGroupEquator::eq((RecGroupEquator *)this,HVar5,
                                           (HeapType)*(uintptr_t *)(uVar25 + 0x38));
              break;
            default:
              handle_unreachable("unexpected kind",
                                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                                 ,0x895);
            }
            if (bVar11 == false) goto LAB_00cb2eab;
          }
LAB_00cb2e43:
          lVar23 = lVar23 + 1;
          if (lVar23 == local_48) break;
        } while( true );
      }
    }
    if (*plVar16 != 0) {
      return (RecGroup)*(uintptr_t *)(*plVar16 + 8);
    }
  }
LAB_00cb2ef4:
  puVar17 = (undefined8 *)operator_new(0x18);
  *puVar17 = 0;
  puVar17[1] = this;
  auVar28 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      (0x10b2728,wasm::(anonymous_namespace)::globalRecGroupStore._48_8_,
                       wasm::(anonymous_namespace)::globalRecGroupStore._64_8_);
  __n = auVar28._8_8_;
  if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (__n == 1) {
      wasm::(anonymous_namespace)::globalRecGroupStore._88_8_ = 0;
      __s = (_Hash_node_base **)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x58);
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      ((new_allocator<std::__detail::_Hash_node_base_*> *)local_60,__n,(void *)0x0);
      memset(__s,0,__n * 8);
    }
    p_Var24 = (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = 0;
    if (p_Var24 != (_Hash_node_base *)0x0) {
      uVar22 = 0;
      do {
        p_Var9 = p_Var24->_M_nxt;
        uVar25 = (ulong)p_Var24[2]._M_nxt % __n;
        if (__s[uVar25] == (_Hash_node_base *)0x0) {
          p_Var24->_M_nxt =
               (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
          wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var24;
          __s[uVar25] = (_Hash_node_base *)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x38)
          ;
          if (p_Var24->_M_nxt != (_Hash_node_base *)0x0) {
            p_Var18 = (_Hash_node_base *)(__s + uVar22);
            goto LAB_00cb2fd5;
          }
        }
        else {
          p_Var24->_M_nxt = __s[uVar25]->_M_nxt;
          p_Var18 = __s[uVar25];
          uVar25 = uVar22;
LAB_00cb2fd5:
          p_Var18->_M_nxt = p_Var24;
        }
        p_Var24 = p_Var9;
        uVar22 = uVar25;
      } while (p_Var9 != (_Hash_node_base *)0x0);
    }
    if (wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ != 0x10b2738) {
      operator_delete((void *)wasm::(anonymous_namespace)::globalRecGroupStore._40_8_,
                      wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ << 3);
    }
    uVar22 = uVar20 % __n;
    wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ = __s;
    wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ = __n;
  }
  lVar23 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
  puVar17[2] = uVar20;
  puVar10 = *(undefined8 **)(lVar23 + uVar22 * 8);
  if (puVar10 == (undefined8 *)0x0) {
    *puVar17 = wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    if (wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ != 0) {
      puVar1 = (ulong *)(wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ + 0x10);
      wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = puVar17;
      *(undefined8 **)
       (lVar23 + (*puVar1 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_) * 8) =
           puVar17;
      lVar23 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
      puVar17 = (undefined8 *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    }
    wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = puVar17;
    *(undefined8 *)(lVar23 + uVar22 * 8) = 0x10b2718;
  }
  else {
    *puVar17 = *puVar10;
    **(undefined8 **)(lVar23 + uVar22 * 8) = puVar17;
  }
  wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ =
       wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ + 1;
  return (RecGroup)(uintptr_t)this;
}

Assistant:

RecGroup insert(RecGroup group) {
    RecGroupStructure structure{group};
    auto [it, inserted] = canonicalGroups.insert(structure);
    if (inserted) {
      return group;
    } else {
      return it->group;
    }
  }